

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

HierarchyCPT * __thiscall
despot::Parser::CreateHierarchyStateTransition(Parser *this,TiXmlElement *e_CondProb)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  NamedVar *pNVar2;
  pointer pcVar3;
  double dVar4;
  pointer pdVar5;
  bool bVar6;
  bool bVar7;
  bool condition;
  int iVar8;
  uint uVar9;
  TiXmlElement *pTVar10;
  char *pcVar11;
  long *plVar12;
  TiXmlNode *pTVar13;
  mapped_type *ppVVar14;
  undefined7 extraout_var;
  TiXmlElement *pTVar15;
  size_type *psVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  pointer pbVar20;
  string parent_name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  vector<double,_std::allocator<double>_> values;
  vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> parents;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parent_names;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  value_tokens;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  HierarchyCPT *local_280;
  undefined1 local_278 [32];
  TiXmlElement *local_258;
  Parser *local_250;
  TiXmlElement *local_248;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_240;
  vector<double,_std::allocator<double>_> local_228;
  vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> local_208;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_170;
  string local_158;
  NamedVar *local_138;
  vector<despot::NamedVar,_std::allocator<despot::NamedVar>_> *local_130;
  vector<despot::StateVar,_std::allocator<despot::StateVar>_> *local_128;
  vector<despot::StateVar,_std::allocator<despot::StateVar>_> *local_120;
  string local_118;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  string local_e0;
  vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> local_c0;
  string local_a8;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> local_48;
  
  local_258 = e_CondProb;
  pTVar10 = util::tinyxml::TiXmlNode::FirstChildElement(&e_CondProb->super_TiXmlNode,"Var");
  pcVar11 = util::tinyxml::TiXmlElement::GetText(pTVar10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,pcVar11,(allocator<char> *)&local_2a8);
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,local_68._M_dataplus._M_p,
             local_68._M_dataplus._M_p + local_68._M_string_length);
  local_128 = &this->curr_state_vars_;
  bVar6 = Variable::IsVariableName(&local_88,local_128);
  std::operator+(&local_2a8,"In <StateTransitionFunction>: Var ",&local_68);
  plVar12 = (long *)std::__cxx11::string::append((char *)&local_2a8);
  psVar16 = (size_type *)(plVar12 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar12 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar16) {
    local_158.field_2._M_allocated_capacity = *psVar16;
    local_158.field_2._8_8_ = plVar12[3];
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  }
  else {
    local_158.field_2._M_allocated_capacity = *psVar16;
    local_158._M_dataplus._M_p = (pointer)*plVar12;
  }
  local_158._M_string_length = plVar12[1];
  *plVar12 = (long)psVar16;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  pTVar13 = util::tinyxml::TiXmlNode::FirstChild(&local_258->super_TiXmlNode,"Var");
  Ensure(this,bVar6,&local_158,&pTVar13->super_TiXmlBase);
  local_250 = this;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  paVar1 = &local_2a8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  local_248 = (TiXmlElement *)&local_250->variables_;
  ppVVar14 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*>_>_>
                           *)local_248,&local_68);
  pNVar2 = (NamedVar *)*ppVVar14;
  local_208.super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_208.super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_208.super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pTVar10 = util::tinyxml::TiXmlNode::FirstChildElement(&local_258->super_TiXmlNode,"Parent");
  pcVar11 = util::tinyxml::TiXmlElement::GetText(pTVar10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a8,pcVar11,(allocator<char> *)local_278);
  local_278._0_8_ = local_278 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_278," ","");
  Tokenize(&local_170,&local_2a8,(string *)local_278);
  if ((mapped_type)local_278._0_8_ != (mapped_type)(local_278 + 0x10)) {
    operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
  }
  local_138 = pNVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  if (local_170.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_170.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_120 = &local_250->prev_state_vars_;
    local_130 = &local_250->action_vars_;
    lVar17 = 8;
    uVar19 = 0;
    do {
      lVar18 = *(long *)((long)local_170.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar17 + -8);
      local_2a8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2a8,lVar18,
                 *(long *)((long)&((local_170.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                          lVar17) + lVar18);
      local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_190,local_2a8._M_dataplus._M_p,
                 local_2a8._M_dataplus._M_p + local_2a8._M_string_length);
      bVar6 = Variable::IsVariableName(&local_190,local_120);
      condition = true;
      if (bVar6) {
LAB_00151455:
        local_280 = (HierarchyCPT *)((ulong)local_280 & 0xffffffff00000000);
      }
      else {
        local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1b0,local_2a8._M_dataplus._M_p,
                   local_2a8._M_dataplus._M_p + local_2a8._M_string_length);
        bVar7 = Variable::IsVariableName(&local_1b0,local_128);
        if (bVar7) goto LAB_00151455;
        local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1d0,local_2a8._M_dataplus._M_p,
                   local_2a8._M_dataplus._M_p + local_2a8._M_string_length);
        condition = Variable::IsVariableName(&local_1d0,local_130);
        local_280 = (HierarchyCPT *)CONCAT44(local_280._4_4_,(int)CONCAT71(extraout_var,1));
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278,
                     "In <StateTransitionFunction>: Parent ",&local_2a8);
      plVar12 = (long *)std::__cxx11::string::append((char *)local_278);
      local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
      psVar16 = (size_type *)(plVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar16) {
        local_1f0.field_2._M_allocated_capacity = *psVar16;
        local_1f0.field_2._8_8_ = plVar12[3];
      }
      else {
        local_1f0.field_2._M_allocated_capacity = *psVar16;
        local_1f0._M_dataplus._M_p = (pointer)*plVar12;
      }
      local_1f0._M_string_length = plVar12[1];
      *plVar12 = (long)psVar16;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      pTVar13 = util::tinyxml::TiXmlNode::FirstChild(&local_258->super_TiXmlNode,"Parent");
      Ensure(local_250,condition,&local_1f0,&pTVar13->super_TiXmlBase);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
      }
      if ((mapped_type)local_278._0_8_ != (mapped_type)(local_278 + 0x10)) {
        operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
      }
      if (((char)local_280 != '\0') &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2)) {
        operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
      }
      if ((!bVar6) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p != &local_1b0.field_2)) {
        operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != &local_190.field_2) {
        operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
      }
      ppVVar14 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*>_>_>
                               *)local_248,&local_2a8);
      local_278._0_8_ = *ppVVar14;
      std::vector<despot::NamedVar*,std::allocator<despot::NamedVar*>>::
      emplace_back<despot::NamedVar*>
                ((vector<despot::NamedVar*,std::allocator<despot::NamedVar*>> *)&local_208,
                 (NamedVar **)local_278);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p != paVar1) {
        operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
      }
      uVar19 = uVar19 + 1;
      lVar17 = lVar17 + 0x20;
    } while (uVar19 < (ulong)((long)local_170.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_170.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  local_280 = (HierarchyCPT *)operator_new(0x70);
  std::vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::vector(&local_c0,&local_208)
  ;
  HierarchyCPT::HierarchyCPT(local_280,local_138,&local_c0);
  if (local_c0.super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.
                    super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_c0.
                          super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.
                          super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pTVar10 = util::tinyxml::TiXmlNode::FirstChildElement(&local_258->super_TiXmlNode,"Dependency");
  pTVar10 = util::tinyxml::TiXmlNode::FirstChildElement(&pTVar10->super_TiXmlNode,"Vars");
  if (pTVar10 != (TiXmlElement *)0x0) {
    do {
      pcVar11 = util::tinyxml::TiXmlElement::GetText(pTVar10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2a8,pcVar11,(allocator<char> *)&local_228);
      local_278._0_8_ = local_278 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_278," ","");
      Tokenize(&local_240,&local_2a8,(string *)local_278);
      if ((mapped_type)local_278._0_8_ != (mapped_type)(local_278 + 0x10)) {
        operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
        operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
      }
      pNVar2 = *local_208.
                super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      pcVar3 = ((local_240.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
      local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_e0,pcVar3,
                 pcVar3 + (local_240.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
      iVar8 = Variable::IndexOf(&pNVar2->super_Variable,&local_e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
      local_2a8._M_dataplus._M_p = (pointer)0x0;
      local_2a8._M_string_length = 0;
      local_2a8.field_2._M_allocated_capacity = 0;
      if (0x20 < (ulong)((long)local_240.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_240.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)) {
        uVar19 = 1;
        lVar17 = 0x20;
        do {
          ppVVar14 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*>_>_>
                                   *)local_248,
                                  (key_type *)
                                  ((long)&((local_240.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)
                                          ._M_p + lVar17));
          local_278._0_8_ = *ppVVar14;
          std::vector<despot::NamedVar*,std::allocator<despot::NamedVar*>>::
          emplace_back<despot::NamedVar*>
                    ((vector<despot::NamedVar*,std::allocator<despot::NamedVar*>> *)&local_2a8,
                     (NamedVar **)local_278);
          uVar19 = uVar19 + 1;
          lVar17 = lVar17 + 0x20;
        } while (uVar19 < (ulong)((long)local_240.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_240.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 5));
      }
      std::vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::vector
                (&local_48,
                 (vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *)&local_2a8);
      HierarchyCPT::SetParents(local_280,iVar8,&local_48);
      if (local_48.super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.
                        super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_48.
                              super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.
                              super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      pTVar10 = util::tinyxml::TiXmlNode::NextSiblingElement(&pTVar10->super_TiXmlNode);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_2a8._M_dataplus._M_p,
                        local_2a8.field_2._M_allocated_capacity - (long)local_2a8._M_dataplus._M_p);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_240);
    } while (pTVar10 != (TiXmlElement *)0x0);
  }
  pTVar10 = GetParameterElement(local_250,local_258);
  pTVar10 = util::tinyxml::TiXmlNode::FirstChildElement(&pTVar10->super_TiXmlNode,"Entry");
  if (pTVar10 != (TiXmlElement *)0x0) {
    do {
      pTVar15 = util::tinyxml::TiXmlNode::FirstChildElement(&pTVar10->super_TiXmlNode,"Instance");
      pcVar11 = util::tinyxml::TiXmlElement::GetText(pTVar15);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2a8,pcVar11,(allocator<char> *)local_278);
      local_278._0_8_ = local_278 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_278," ","");
      Tokenize(&local_240,&local_2a8,(string *)local_278);
      if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
        operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
        operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
      }
      local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      pTVar15 = util::tinyxml::TiXmlNode::FirstChildElement(&pTVar10->super_TiXmlNode,"ProbTable");
      pcVar11 = util::tinyxml::TiXmlElement::GetText(pTVar15);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2a8,pcVar11,(allocator<char> *)local_278);
      local_278._0_8_ = local_278 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_278," ","");
      Tokenize(&local_f8,&local_2a8,(string *)local_278);
      local_248 = pTVar10;
      if ((mapped_type)local_278._0_8_ != (mapped_type)(local_278 + 0x10)) {
        operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
      }
      std::vector<double,_std::allocator<double>_>::resize
                (&local_228,
                 (long)local_f8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_f8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5);
      pdVar5 = local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((long)local_f8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_f8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start != 0) {
        lVar18 = (long)local_f8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_f8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5;
        lVar17 = 0;
        pbVar20 = local_f8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          dVar4 = atof((pbVar20->_M_dataplus)._M_p);
          pdVar5[lVar17] = dVar4;
          lVar17 = lVar17 + 1;
          pbVar20 = pbVar20 + 1;
        } while (lVar18 + (ulong)(lVar18 == 0) != lVar17);
      }
      pNVar2 = *local_208.
                super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      pcVar3 = ((local_240.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_a8,pcVar3,
                 pcVar3 + (local_240.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
      uVar9 = Variable::IndexOf(&pNVar2->super_Variable,&local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_erase(&local_240,
                 (iterator)
                 local_240.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      iVar8 = (*(local_280->super_CPT).super_Function._vptr_Function[0x12])
                        (local_280,(ulong)uVar9,&local_240,&local_228);
      pTVar10 = local_248;
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_118,"In <StateTransitionFunction>: Value assignment failed.","");
      pTVar15 = util::tinyxml::TiXmlNode::FirstChildElement(&pTVar10->super_TiXmlNode,"Instance");
      Ensure(local_250,SUB41(iVar8,0),&local_118,(TiXmlBase *)pTVar15);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      pTVar10 = util::tinyxml::TiXmlNode::NextSiblingElement(&pTVar10->super_TiXmlNode);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
        operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
      }
      if (local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_240);
    } while (pTVar10 != (TiXmlElement *)0x0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_170);
  if (local_208.super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_208.
                    super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_208.
                          super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_208.
                          super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return local_280;
}

Assistant:

HierarchyCPT* Parser::CreateHierarchyStateTransition(TiXmlElement* e_CondProb) {
	// <Var>
	string name = GetFirstChildText(e_CondProb, "Var");

	Ensure(Variable::IsVariableName(name, curr_state_vars_),
		"In <StateTransitionFunction>: Var " + name
			+ " has not been declared as a StateVar vnameCurr within the <Variable> tag.",
		e_CondProb->FirstChild("Var"));

	StateVar* child = static_cast<StateVar*>(variables_[name]);

	// <Parent>
	vector<NamedVar*> parents;
	vector<string> parent_names = Tokenize(
		GetFirstChildText(e_CondProb, "Parent"));
	for (int i = 0; i < parent_names.size(); i++) {
		string parent_name = parent_names[i];
		Ensure(
			Variable::IsVariableName(parent_name, prev_state_vars_)
				|| Variable::IsVariableName(parent_name, curr_state_vars_)
				|| Variable::IsVariableName(parent_name, action_vars_),
			"In <StateTransitionFunction>: Parent " + parent_name
				+ " has not been declared as a StateVar vnamePrev/vnameCurr or an ActionVar vname within the <Variable> tag.",
			e_CondProb->FirstChild("Parent"));

		parents.push_back(static_cast<StateVar*>(variables_[parent_name]));
	}

	HierarchyCPT* func = new HierarchyCPT(child, parents);

	TiXmlElement* e_Dependency = GetFirstChildElement(e_CondProb, "Dependency");
	TiXmlElement* e_Vars = GetFirstChildElement(e_Dependency, "Vars");
	while (e_Vars != NULL) {
		vector<string> tokens = Tokenize(e_Vars->GetText());
		int val = parents[0]->IndexOf(tokens[0]);
		vector<NamedVar*> vars;
		for (int i = 1; i < tokens.size(); i++)
			vars.push_back(static_cast<NamedVar*>(variables_[tokens[i]]));
		func->SetParents(val, vars);

		e_Vars = e_Vars->NextSiblingElement();
	}

	// <Parameter>
	TiXmlElement* e_Parameter = GetParameterElement(e_CondProb);
	TiXmlElement* e_Entry = e_Parameter->FirstChildElement("Entry");
	while (e_Entry != NULL) {
		// <Instance>
		vector<string> instance = Tokenize(
			GetFirstChildText(e_Entry, "Instance"));

		// <ProbTable>
		vector<double> values;
		string table = GetFirstChildText(e_Entry, "ProbTable");

		vector<string> value_tokens = Tokenize(table);

		values.resize(value_tokens.size());
		for (int i = 0; i < value_tokens.size(); i++) {
			values[i] = atof(value_tokens[i].c_str());
		}

		int val = parents[0]->IndexOf(instance[0]);
		instance.erase(instance.begin());
		bool success = func->SetValue(val, instance, values);

		Ensure(success,
			"In <StateTransitionFunction>: Value assignment failed.",
			GetFirstChildElement(e_Entry, "Instance"));

		e_Entry = e_Entry->NextSiblingElement();
	}

	return func;
}